

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double r_exec::View::MorphChange(double change,double source_thr,double destination_thr)

{
  double destination_thr_local;
  double source_thr_local;
  double change_local;
  
  if (source_thr <= 0.0) {
    change_local = destination_thr + change;
  }
  else {
    change_local = change;
    if (0.0 < destination_thr) {
      change_local = (change * destination_thr) / source_thr;
    }
  }
  return change_local;
}

Assistant:

double View::MorphChange(double change, double source_thr, double destination_thr)   // change is always >0.
{
    if (source_thr > 0) {
        if (destination_thr > 0) {
            return change * destination_thr / source_thr;
        } else {
            return change;
        }
    }

    return destination_thr + change;
}